

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O0

int Abc_NtkRenodeEvalCnf(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  int iVar2;
  int nVars;
  char *pcVar3;
  uint *puVar4;
  uint *puVar5;
  int nClauses;
  int RetValue;
  int i;
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pcVar3 = If_CutPerm(pCut);
  nClauses = 0;
  while( true ) {
    iVar1 = If_CutLeaveNum(pCut);
    if (iVar1 <= nClauses) break;
    pcVar3[nClauses] = '\x01';
    nClauses = nClauses + 1;
  }
  puVar4 = If_CutTruth(p,pCut);
  iVar1 = If_CutLeaveNum(pCut);
  iVar1 = Kit_TruthIsop(puVar4,iVar1,s_vMemory,0);
  if (iVar1 == -1) {
    p_local._4_4_ = 0xfff;
  }
  else {
    if ((iVar1 != 0) && (iVar1 != 1)) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRenode.c"
                    ,0x108,"int Abc_NtkRenodeEvalCnf(If_Man_t *, If_Cut_t *)");
    }
    iVar1 = Vec_IntSize(s_vMemory);
    puVar4 = If_CutTruth(p,pCut);
    puVar5 = If_CutTruth(p,pCut);
    iVar2 = If_CutLeaveNum(pCut);
    Kit_TruthNot(puVar4,puVar5,iVar2);
    puVar4 = If_CutTruth(p,pCut);
    iVar2 = If_CutLeaveNum(pCut);
    iVar2 = Kit_TruthIsop(puVar4,iVar2,s_vMemory,0);
    puVar4 = If_CutTruth(p,pCut);
    puVar5 = If_CutTruth(p,pCut);
    nVars = If_CutLeaveNum(pCut);
    Kit_TruthNot(puVar4,puVar5,nVars);
    if (iVar2 == -1) {
      p_local._4_4_ = 0xfff;
    }
    else {
      if ((iVar2 != 0) && (iVar2 != 1)) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRenode.c"
                      ,0x110,"int Abc_NtkRenodeEvalCnf(If_Man_t *, If_Cut_t *)");
      }
      iVar2 = Vec_IntSize(s_vMemory);
      p_local._4_4_ = iVar2 + iVar1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkRenodeEvalCnf( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue, nClauses;
    // set internal mapper parameters
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    // compute ISOP for the positive phase
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    nClauses = Vec_IntSize( s_vMemory );
    // compute ISOP for the negative phase
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    nClauses += Vec_IntSize( s_vMemory );
    return nClauses;
}